

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkPrintAllStats(void *arkode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  undefined8 uVar1;
  int iVar2;
  int error_code;
  char *pcVar3;
  
  if (arkode_mem == (void *)0x0) {
    pcVar3 = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
LAB_004ef61e:
    arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkPrintAllStats",pcVar3);
  }
  else {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      fprintf((FILE *)outfile,"Time,%.16g",*(undefined8 *)((long)arkode_mem + 0x198));
      fprintf((FILE *)outfile,",Steps,%ld",*(undefined8 *)((long)arkode_mem + 0x1d8));
      fprintf((FILE *)outfile,",Step attempts,%ld",*(undefined8 *)((long)arkode_mem + 0x1d0));
      fprintf((FILE *)outfile,",Stability limited steps,%ld",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x1b0) + 0xd8));
      fprintf((FILE *)outfile,",Accuracy limited steps,%ld",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x1b0) + 0xd0));
      fprintf((FILE *)outfile,",Error test fails,%ld",*(undefined8 *)((long)arkode_mem + 0x1f0));
      fprintf((FILE *)outfile,",NLS step fails,%ld",*(undefined8 *)((long)arkode_mem + 0x1e8));
      fprintf((FILE *)outfile,",Inequality constraint fails,%ld",
              *(undefined8 *)((long)arkode_mem + 0x1f8));
      fprintf((FILE *)outfile,",Initial step size,%.16g",*(undefined8 *)((long)arkode_mem + 0x228));
      fprintf((FILE *)outfile,",Last step size,%.16g",*(undefined8 *)((long)arkode_mem + 0x238));
      fprintf((FILE *)outfile,",Current step size,%.16g",*(undefined8 *)((long)arkode_mem + 0x188));
      if (*(long *)((long)arkode_mem + 0x280) == 0) {
        return 0;
      }
      uVar1 = *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x68);
      pcVar3 = ",Roof fn evals,%ld";
    }
    else {
      if (fmt != SUN_OUTPUTFORMAT_TABLE) {
        pcVar3 = "Invalid formatting option.";
        iVar2 = -0x16;
        error_code = -0x16;
        goto LAB_004ef61e;
      }
      fprintf((FILE *)outfile,"Current time                 = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x198));
      fprintf((FILE *)outfile,"Steps                        = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x1d8));
      fprintf((FILE *)outfile,"Step attempts                = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x1d0));
      fprintf((FILE *)outfile,"Stability limited steps      = %ld\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x1b0) + 0xd8));
      fprintf((FILE *)outfile,"Accuracy limited steps       = %ld\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x1b0) + 0xd0));
      fprintf((FILE *)outfile,"Error test fails             = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x1f0));
      fprintf((FILE *)outfile,"NLS step fails               = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x1e8));
      fprintf((FILE *)outfile,"Inequality constraint fails  = %ld\n",
              *(undefined8 *)((long)arkode_mem + 0x1f8));
      fprintf((FILE *)outfile,"Initial step size            = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x228));
      fprintf((FILE *)outfile,"Last step size               = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x238));
      fprintf((FILE *)outfile,"Current step size            = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x188));
      if (*(long *)((long)arkode_mem + 0x280) == 0) {
        return 0;
      }
      uVar1 = *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x68);
      pcVar3 = "Root fn evals                = %ld\n";
    }
    iVar2 = 0;
    fprintf((FILE *)outfile,pcVar3,uVar1);
  }
  return iVar2;
}

Assistant:

int arkPrintAllStats(void *arkode_mem, FILE *outfile, SUNOutputFormat fmt)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;

  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPrintAllStats", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  switch(fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "Current time                 = %"RSYM"\n", ark_mem->tcur);
    fprintf(outfile, "Steps                        = %ld\n", ark_mem->nst);
    fprintf(outfile, "Step attempts                = %ld\n", ark_mem->nst_attempts);
    fprintf(outfile, "Stability limited steps      = %ld\n", ark_mem->hadapt_mem->nst_exp);
    fprintf(outfile, "Accuracy limited steps       = %ld\n", ark_mem->hadapt_mem->nst_acc);
    fprintf(outfile, "Error test fails             = %ld\n", ark_mem->netf);
    fprintf(outfile, "NLS step fails               = %ld\n", ark_mem->ncfn);
    fprintf(outfile, "Inequality constraint fails  = %ld\n", ark_mem->nconstrfails);
    fprintf(outfile, "Initial step size            = %"RSYM"\n", ark_mem->h0u);
    fprintf(outfile, "Last step size               = %"RSYM"\n", ark_mem->hold);
    fprintf(outfile, "Current step size            = %"RSYM"\n", ark_mem->next_h);
    if (ark_mem->root_mem)
    {
      ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;
      fprintf(outfile, "Root fn evals                = %ld\n", ark_root_mem->nge);
    }
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, "Time,%"RSYM, ark_mem->tcur);
    fprintf(outfile, ",Steps,%ld", ark_mem->nst);
    fprintf(outfile, ",Step attempts,%ld", ark_mem->nst_attempts);
    fprintf(outfile, ",Stability limited steps,%ld", ark_mem->hadapt_mem->nst_exp);
    fprintf(outfile, ",Accuracy limited steps,%ld", ark_mem->hadapt_mem->nst_acc);
    fprintf(outfile, ",Error test fails,%ld", ark_mem->netf);
    fprintf(outfile, ",NLS step fails,%ld", ark_mem->ncfn);
    fprintf(outfile, ",Inequality constraint fails,%ld", ark_mem->nconstrfails);
    fprintf(outfile, ",Initial step size,%"RSYM, ark_mem->h0u);
    fprintf(outfile, ",Last step size,%"RSYM, ark_mem->hold);
    fprintf(outfile, ",Current step size,%"RSYM, ark_mem->next_h);
    if (ark_mem->root_mem)
    {
      ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;
      fprintf(outfile, ",Roof fn evals,%ld", ark_root_mem->nge);
    }
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkPrintAllStats",
                    "Invalid formatting option.");
    return(ARK_ILL_INPUT);
  }

  return(ARK_SUCCESS);
}